

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall cppnet::RWSocket::AddTimer(RWSocket *this,uint32_t interval,bool always)

{
  bool bVar1;
  uint32_t uVar2;
  element_type *this_00;
  enable_shared_from_this<cppnet::RWSocket> local_38;
  undefined1 local_28 [8];
  shared_ptr<cppnet::Dispatcher> dispatcher;
  bool always_local;
  uint32_t interval_local;
  RWSocket *this_local;
  
  if (this->_timer_id == 0) {
    dispatcher.super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _3_1_ = always;
    dispatcher.super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = interval;
    Socket::GetDispatcher((Socket *)local_28);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_28);
      std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this(&local_38);
      uVar2 = Dispatcher::AddTimer
                        (this_00,(shared_ptr<cppnet::RWSocket> *)&local_38,
                         dispatcher.
                         super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._4_4_,
                         (bool)(dispatcher.
                                super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._3_1_ & 1));
      this->_timer_id = uVar2;
      std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)&local_38);
    }
    std::shared_ptr<cppnet::Dispatcher>::~shared_ptr((shared_ptr<cppnet::Dispatcher> *)local_28);
  }
  return;
}

Assistant:

void RWSocket::AddTimer(uint32_t interval, bool always) {
    if (_timer_id > 0) {
        return;
    }
    
    auto dispatcher = GetDispatcher();
    if (dispatcher) {
        _timer_id = dispatcher->AddTimer(shared_from_this(), interval, always);
    }
}